

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Sweep.c
# Opt level: O3

void Llb4_Nonlin4Sweep(Aig_Man_t *pAig,int nSweepMax,int nClusterMax,DdManager **pdd,
                      Vec_Int_t **pvOrder,Vec_Ptr_t **pvGroups,int fVerbose)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  DdManager *ddSource;
  DdManager *ddDestination;
  DdNode *n;
  int Counter;
  Vec_Ptr_t *vGroups;
  int local_54;
  Vec_Ptr_t **local_50;
  DdManager **local_48;
  Vec_Int_t **local_40;
  Vec_Ptr_t *local_38;
  
  local_48 = pdd;
  local_40 = pvOrder;
  Aig_ManCleanMarkA(pAig);
  pVVar2 = Llb_Nonlin4SweepOrder(pAig,&local_54,1);
  if (local_54 != pAig->nObjs[6] + pAig->nObjs[5]) {
    __assert_fail("Counter == Aig_ManNodeNum(pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb4Sweep.c"
                  ,0x212,
                  "void Llb4_Nonlin4Sweep(Aig_Man_t *, int, int, DdManager **, Vec_Int_t **, Vec_Ptr_t **, int)"
                 );
  }
  local_50 = pvGroups;
  iVar1 = Llb4_Nonlin4SweepCutpoints(pAig,pVVar2,nSweepMax,fVerbose);
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
  }
  free(pVVar2);
  pVVar2 = Llb_Nonlin4SweepOrder(pAig,&local_54,0);
  if (local_54 == iVar1) {
    Aig_ManCleanMarkA(pAig);
    ddSource = Llb4_Nonlin4SweepBadStates(pAig,pVVar2,pAig->nObjs[2] + iVar1 + pAig->nObjs[3]);
    ddDestination =
         Llb4_Nonlin4SweepGroups
                   (pAig,pVVar2,iVar1 + pAig->nObjs[2] + pAig->nObjs[3],&local_38,nClusterMax,
                    fVerbose);
    n = Cudd_bddTransfer(ddSource,ddDestination,ddSource->bFunc);
    ddDestination->bFunc = n;
    Cudd_Ref(n);
    Cudd_RecursiveDeref(ddSource,ddSource->bFunc);
    ddSource->bFunc = (DdNode *)0x0;
    Extra_StopManager(ddSource);
    Llb_Nonlin4SweepPrintSuppProfile(ddDestination,pAig,pVVar2,local_38,fVerbose);
    *local_48 = ddDestination;
    *local_40 = pVVar2;
    *local_50 = local_38;
    return;
  }
  __assert_fail("Counter == nCutPoints",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb4Sweep.c"
                ,0x218,
                "void Llb4_Nonlin4Sweep(Aig_Man_t *, int, int, DdManager **, Vec_Int_t **, Vec_Ptr_t **, int)"
               );
}

Assistant:

void Llb4_Nonlin4Sweep( Aig_Man_t * pAig, int nSweepMax, int nClusterMax, DdManager ** pdd, Vec_Int_t ** pvOrder, Vec_Ptr_t ** pvGroups, int fVerbose )
{
    DdManager * ddBad, * ddWork;
    Vec_Ptr_t * vGroups;
    Vec_Int_t * vOrder;
    int Counter, nCutPoints;

    // get the original ordering
    Aig_ManCleanMarkA( pAig );
    vOrder = Llb_Nonlin4SweepOrder( pAig, &Counter, 1 );
    assert( Counter == Aig_ManNodeNum(pAig) );
    // mark the nodes
    nCutPoints = Llb4_Nonlin4SweepCutpoints( pAig, vOrder, nSweepMax, fVerbose );
    Vec_IntFree( vOrder );
    // get better ordering
    vOrder = Llb_Nonlin4SweepOrder( pAig, &Counter, 0 );
    assert( Counter == nCutPoints );
    Aig_ManCleanMarkA( pAig );
    // compute the BAD states
    ddBad = Llb4_Nonlin4SweepBadStates( pAig, vOrder, nCutPoints + Aig_ManCiNum(pAig) + Aig_ManCoNum(pAig) );
    // compute the clusters
    ddWork = Llb4_Nonlin4SweepGroups( pAig, vOrder, nCutPoints + Aig_ManCiNum(pAig) + Aig_ManCoNum(pAig), &vGroups, nClusterMax, fVerbose );
    // transfer the result from the Bad manager
//printf( "Bad before = %d.\n", Cudd_DagSize(ddBad->bFunc) );
    ddWork->bFunc = Cudd_bddTransfer( ddBad, ddWork, ddBad->bFunc );   Cudd_Ref( ddWork->bFunc );
    Cudd_RecursiveDeref( ddBad, ddBad->bFunc );  ddBad->bFunc = NULL;
    Extra_StopManager( ddBad );
    // update ordering to exclude quantified variables
//printf( "Bad after = %d.\n", Cudd_DagSize(ddWork->bFunc) );

    Llb_Nonlin4SweepPrintSuppProfile( ddWork, pAig, vOrder, vGroups, fVerbose );

    // return the result
    *pdd = ddWork;
    *pvOrder = vOrder;
    *pvGroups = vGroups;
}